

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.cpp
# Opt level: O3

bool __thiscall BufferedFileReader::gotoByte(BufferedFileReader *this,int readerID,int64_t seekDist)

{
  uint uVar1;
  ReaderData *pRVar2;
  int64_t iVar3;
  bool bVar4;
  
  pRVar2 = BufferedReader::getReader(&this->super_BufferedReader,readerID);
  if ((pRVar2 == (ReaderData *)0x0) ||
     (pRVar2->_vptr_ReaderData != (_func_int **)&PTR__FileReaderData_0023d038)) {
    bVar4 = false;
  }
  else {
    uVar1 = (this->super_BufferedReader).super_AbstractReader.m_blockSize;
    bVar4 = false;
    pRVar2->m_blockSize = uVar1 - (int)((ulong)seekDist % (ulong)uVar1);
    iVar3 = File::seek((File *)(pRVar2 + 1),
                       (ulong)*(uint *)&pRVar2[1].m_streamName._M_dataplus._M_p + seekDist,smBegin);
    if (iVar3 != -1) {
      pRVar2->m_eof = false;
      pRVar2->m_notified = false;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool BufferedFileReader::gotoByte(const int readerID, const int64_t seekDist)
{
    const auto data = dynamic_cast<FileReaderData*>(getReader(readerID));
    if (data)
    {
        data->m_blockSize = m_blockSize - static_cast<uint32_t>(seekDist % static_cast<uint64_t>(m_blockSize));
        const uint64_t seekRez = data->m_file.seek(seekDist + data->m_fileHeaderSize, File::SeekMethod::smBegin);
        const bool rez = seekRez != static_cast<uint64_t>(-1);
        if (rez)
        {
            data->m_eof = false;
            data->m_notified = false;
        }
        return rez;
    }
    return false;
}